

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this,string *id,
          FluctuatingAtypeParameters *data)

{
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_0021d168;
  FluctuatingAtypeParameters::FluctuatingAtypeParameters(&this->data_,data);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}